

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regiongraph.cpp
# Opt level: O2

bool __thiscall libDAI::RegionGraph::Check_Counting_Numbers(RegionGraph *this)

{
  pointer pFVar1;
  pointer pRVar2;
  bool bVar3;
  ostream *poVar4;
  size_t alpha;
  ulong uVar5;
  long lVar6;
  pointer n;
  bool bVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  double dVar10;
  
  bVar7 = true;
  for (n = (this->_fg)._fg._V1.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl
           .super__Vector_impl_data._M_start;
      n != (this->_fg)._fg._V1.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl
           .super__Vector_impl_data._M_finish; n = n + 1) {
    dVar10 = 0.0;
    lVar6 = 0;
    for (uVar5 = 0;
        pFVar1 = (this->_rg)._V1.
                 super__Vector_base<libDAI::FRegion,_std::allocator<libDAI::FRegion>_>._M_impl.
                 super__Vector_impl_data._M_start,
        uVar5 < (ulong)((long)(this->_rg)._V1.
                              super__Vector_base<libDAI::FRegion,_std::allocator<libDAI::FRegion>_>.
                              _M_impl.super__Vector_impl_data._M_finish - (long)pFVar1 >> 6);
        uVar5 = uVar5 + 1) {
      bVar3 = VarSet::operator&&((VarSet *)((long)&(pFVar1->super_Factor)._vs + lVar6),n);
      if (bVar3) {
        dVar10 = dVar10 + *(double *)
                           ((long)&((this->_rg)._V1.
                                    super__Vector_base<libDAI::FRegion,_std::allocator<libDAI::FRegion>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->_c + lVar6);
      }
      lVar6 = lVar6 + 0x40;
    }
    lVar6 = 0;
    for (uVar5 = 0;
        pRVar2 = (this->_rg)._V2.super__Vector_base<libDAI::Region,_std::allocator<libDAI::Region>_>
                 ._M_impl.super__Vector_impl_data._M_start,
        uVar5 < (ulong)(((long)(this->_rg)._V2.
                               super__Vector_base<libDAI::Region,_std::allocator<libDAI::Region>_>.
                               _M_impl.super__Vector_impl_data._M_finish - (long)pRVar2) / 0x28);
        uVar5 = uVar5 + 1) {
      bVar3 = VarSet::operator&&((VarSet *)
                                 ((long)&(pRVar2->super_VarSet)._vars.
                                         super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>
                                 + lVar6),n);
      if (bVar3) {
        dVar10 = dVar10 + *(double *)
                           ((long)&((this->_rg)._V2.
                                    super__Vector_base<libDAI::Region,_std::allocator<libDAI::Region>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->_c + lVar6);
      }
      lVar6 = lVar6 + 0x28;
    }
    auVar8._8_8_ = 0x7fffffffffffffff;
    auVar8._0_8_ = 0x7fffffffffffffff;
    auVar9._8_8_ = 0;
    auVar9._0_8_ = dVar10 + -1.0;
    auVar8 = vandpd_avx512vl(auVar9,auVar8);
    if (1e-15 < auVar8._0_8_) {
      poVar4 = std::operator<<((ostream *)&std::cout,
                               "WARNING: counting numbers do not satisfy relation for ");
      poVar4 = libDAI::operator<<(poVar4,n);
      std::operator<<(poVar4,"(c_n = ");
      poVar4 = std::ostream::_M_insert<double>(dVar10);
      poVar4 = std::operator<<(poVar4,").");
      std::endl<char,std::char_traits<char>>(poVar4);
      bVar7 = false;
    }
  }
  return bVar7;
}

Assistant:

bool RegionGraph::Check_Counting_Numbers() {
        // Checks whether the counting numbers satisfy the fundamental relation
        
        bool all_valid = true;
        for( vector<Var>::const_iterator n = _fg.vars().begin(); n != _fg.vars().end(); n++ ) {
            double c_n = 0.0;
            for( size_t alpha = 0; alpha < nr_ORs(); alpha++ )
                if( OR(alpha).vars() && *n )
                    c_n += OR(alpha).c();
            for( size_t beta = 0; beta < nr_IRs(); beta++ )
                if( IR(beta) && *n )
                    c_n += IR(beta).c();
            if( fabs(c_n - 1.0) > 1e-15 ) {
                all_valid = false;
                cout << "WARNING: counting numbers do not satisfy relation for " << *n << "(c_n = " << c_n << ")." << endl;
            }
        }

        return all_valid;
    }